

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testMinMaxEigenValue<Imath_2_5::Matrix33<float>>(Matrix33<float> *A)

{
  size_t i;
  long lVar1;
  float *pfVar2;
  float (*pafVar3) [3];
  size_t j;
  long lVar4;
  float fVar5;
  float fVar6;
  Matrix33<float> V;
  Matrix33<float> U;
  TV maxV;
  TV minV;
  TV S;
  Matrix33<float> A1;
  Matrix33<float> local_c8;
  Matrix33<float> local_a4;
  Vec3<float> local_80;
  Vec3<float> local_74;
  Matrix33<float> local_68;
  Matrix33<float> local_38;
  
  local_a4.x[1][2] = 0.0;
  local_a4.x[2][0] = 0.0;
  local_a4.x[2][1] = 0.0;
  local_a4.x[0][1] = 0.0;
  local_a4.x[0][2] = 0.0;
  local_a4.x[1][0] = 0.0;
  local_a4.x[0][0] = 1.0;
  local_a4.x[1][1] = 1.0;
  local_a4.x[2][2] = 1.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[0][0] = 1.0;
  local_c8.x[1][1] = 1.0;
  local_c8.x[2][2] = 1.0;
  fVar5 = 0.0;
  lVar1 = 0;
  pafVar3 = (float (*) [3])A;
  do {
    lVar4 = 0;
    fVar6 = fVar5;
    do {
      fVar5 = ABS((*(float (*) [3])*pafVar3)[lVar4]);
      if (fVar5 <= fVar6) {
        fVar5 = fVar6;
      }
      lVar4 = lVar4 + 1;
      fVar6 = fVar5;
    } while (lVar4 != 3);
    lVar1 = lVar1 + 1;
    pafVar3 = pafVar3 + 1;
  } while (lVar1 != 3);
  fVar6 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar5) {
    fVar6 = fVar5;
  }
  fVar5 = fVar6 * 100.0 * 1.1920929e-07;
  local_38.x[2][2] = A->x[2][2];
  local_38.x[0]._0_8_ = *(undefined8 *)A->x[0];
  local_38.x._8_8_ = *(undefined8 *)(A->x[0] + 2);
  local_38.x[1]._4_8_ = *(undefined8 *)(A->x[1] + 1);
  local_38.x[2]._0_8_ = *(undefined8 *)A->x[2];
  Imath_2_5::minEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>(&local_38,&local_74);
  local_68.x[2][2] = A->x[2][2];
  local_68.x[0][0] = *(float *)((long)(A->x + 0) + 0);
  local_68.x[0][1] = *(float *)((long)(A->x + 0) + 4);
  local_68.x._8_8_ = *(undefined8 *)(A->x[0] + 2);
  local_68.x[1]._4_8_ = *(undefined8 *)(A->x[1] + 1);
  local_68.x[2]._0_8_ = *(undefined8 *)A->x[2];
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>(&local_68,&local_80);
  local_38.x[2][2] = A->x[2][2];
  local_38.x[0]._0_8_ = *(undefined8 *)A->x[0];
  local_38.x._8_8_ = *(undefined8 *)(A->x[0] + 2);
  local_38.x[1]._4_8_ = *(undefined8 *)(A->x[1] + 1);
  local_38.x[2]._0_8_ = *(undefined8 *)A->x[2];
  lVar1 = 0;
  Imath_2_5::jacobiSVD<float>
            (&local_38,&local_a4,(Vec3<float> *)&local_68,&local_c8,1.1920929e-07,false);
  pfVar2 = local_c8.x[0] + 2;
  while( true ) {
    if (fVar5 <= ABS((&local_74.x)[lVar1] - *pfVar2)) {
      __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]")
      ;
    }
    if (fVar5 <= ABS((&local_80.x)[lVar1] - (*(float (*) [3])(pfVar2 + -2))[0])) break;
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 3;
    if (lVar1 == 3) {
      return;
    }
  }
  __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}